

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O0

bool has_screen_changes(void)

{
  byte *pbVar1;
  CDeviceSlot *pCVar2;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  uchar *pscr;
  
  pCVar2 = CDevice::GetSlot(Device,1);
  pbVar1 = pCVar2->Page->RAM;
  for (local_1c = 0; local_1c < 0x1800; local_1c = local_1c + 1) {
    if (pbVar1[local_1c] != '\0') {
      return true;
    }
  }
  local_20 = 0x1800;
  while( true ) {
    if (0x1aff < local_20) {
      return false;
    }
    if (pbVar1[local_20] != '8') break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

static bool has_screen_changes() {
	unsigned char *pscr = (unsigned char*)Device->GetSlot(1)->Page->RAM;

	for (int i=0; i < 0x1800;i++) {
		if (0 != pscr[i]) {
			return true;
		}
	}

	for (int i=0x1800; i < 0x1B00;i++) {
		if (0x38 != pscr[i]) {
			return true;
		}
	}

	return false;
}